

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

string * __thiscall
Assimp::LWSImporter::FindLWOFile(string *__return_storage_ptr__,LWSImporter *this,string *in)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  pointer pcVar5;
  int iVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  string tmp;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar3 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar3;
  if ((in->_M_string_length < 4) || (pcVar5 = (in->_M_dataplus)._M_p, pcVar5[1] != ':')) {
LAB_003e6c1d:
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  else {
    cVar4 = pcVar5[2];
    if ((cVar4 == '/') || (cVar4 == '\\')) goto LAB_003e6c1d;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,":\\","");
    std::__cxx11::string::substr((ulong)&local_70,(ulong)in);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_70._M_string_length + local_b0._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar10 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_70._M_string_length + local_b0._M_string_length) goto LAB_003e6eba;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_003e6eba:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    }
    local_d0 = &local_c0;
    puVar1 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar1) {
      local_c0 = *puVar1;
      uStack_b8 = puVar7[3];
    }
    else {
      local_c0 = *puVar1;
      local_d0 = (ulong *)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::insert((ulong)&local_d0,0,'\x01');
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = puVar7[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_90._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*this->io->_vptr_IOSystem[2])(this->io,local_50._M_dataplus._M_p);
  if ((char)iVar6 != '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (in->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + in->_M_string_length);
    goto LAB_003e6fc2;
  }
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"..","");
  iVar6 = (*this->io->_vptr_IOSystem[3])();
  std::operator+(&local_b0,(char)iVar6,&local_50);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < local_b0._M_string_length + local_c8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_b0._M_string_length + local_c8) goto LAB_003e6ced;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_003e6ced:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90.field_2._8_8_ = puVar7[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_90._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)psVar8 = 0;
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  iVar6 = (*this->io->_vptr_IOSystem[2])(this->io,local_90._M_dataplus._M_p);
  if ((char)iVar6 == '\0') {
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"..","");
    iVar6 = (*this->io->_vptr_IOSystem[3])();
    std::operator+(&local_70,(char)iVar6,&local_90);
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_70._M_string_length + local_b0._M_string_length) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar10 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_70._M_string_length + local_b0._M_string_length) goto LAB_003e6e25;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_003e6e25:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    }
    puVar1 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar1) {
      local_c0 = *puVar1;
      uStack_b8 = puVar7[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar1;
      local_d0 = (ulong *)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    iVar6 = (*this->io->_vptr_IOSystem[2])(this->io,local_90._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((char)iVar6 == '\0') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar3) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_50._M_string_length;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003e6fc2;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_90.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_90.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_90._M_string_length;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
LAB_003e6fc2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LWSImporter::FindLWOFile(const std::string& in)
{
    // insert missing directory separator if necessary
    std::string tmp;
    if (in.length() > 3 && in[1] == ':'&& in[2] != '\\' && in[2] != '/')
    {
        tmp = in[0] + (std::string(":\\") + in.substr(2));
    }
    else tmp = in;

    if (io->Exists(tmp)) {
        return in;
    }

    // file is not accessible for us ... maybe it's packed by
    // LightWave's 'Package Scene' command?

    // Relevant for us are the following two directories:
    // <folder>\Objects\<hh>\<*>.lwo
    // <folder>\Scenes\<hh>\<*>.lws
    // where <hh> is optional.

    std::string test = std::string("..") + (io->getOsSeparator() + tmp);
    if (io->Exists(test)) {
        return test;
    }

    test = std::string("..") + (io->getOsSeparator() + test);
    if (io->Exists(test)) {
        return test;
    }


    // return original path, maybe the IOsystem knows better
    return tmp;
}